

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::Test_TemplateDictionary_SetValueAndTemplateStringAndArena::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  str_ref value;
  str_ref value_00;
  str_ref value_01;
  allocator local_3f1;
  string dump;
  TemplateDictionaryPeer peer;
  undefined7 uStack_397;
  UnsafeArena *arenas [3];
  uint7 uStack_357;
  TemplateDictionary dict;
  TemplateString local_2d8;
  TemplateString local_2b8;
  char expected [256];
  UnsafeArena arena;
  
  ctemplate::UnsafeArena::UnsafeArena(&arena,100);
  arenas[2] = (UnsafeArena *)0x0;
  uVar9 = 0;
  arenas[0] = &arena;
  arenas[1] = &arena;
  while( true ) {
    if (uVar9 == 3) {
      ctemplate::BaseArena::~BaseArena(&arena.super_BaseArena);
      return;
    }
    std::__cxx11::string::string((string *)&peer,"test_arena",&local_3f1);
    std::operator+(&dump,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&peer,
                   (char)uVar9 + '0');
    expected._0_8_ = dump._M_dataplus._M_p;
    expected[8] = (undefined1)dump._M_string_length;
    expected[9] = dump._M_string_length._1_1_;
    expected[10] = dump._M_string_length._2_1_;
    expected[0xb] = dump._M_string_length._3_1_;
    expected[0xc] = dump._M_string_length._4_1_;
    expected[0xd] = dump._M_string_length._5_1_;
    expected[0xe] = dump._M_string_length._6_1_;
    expected[0xf] = dump._M_string_length._7_1_;
    expected[0x10] = '\0';
    expected[0x18] = '\0';
    expected[0x19] = '\0';
    expected[0x1a] = '\0';
    expected[0x1b] = '\0';
    expected[0x1c] = '\0';
    expected[0x1d] = '\0';
    expected[0x1e] = '\0';
    expected[0x1f] = '\0';
    ctemplate::TemplateDictionary::TemplateDictionary
              (&dict,(TemplateString *)expected,arenas[uVar9]);
    std::__cxx11::string::~string((string *)&dump);
    std::__cxx11::string::~string((string *)&peer);
    ctemplate::TemplateString::TemplateString(&local_2b8,"FOO");
    ctemplate::TemplateString::TemplateString(&local_2d8,"foo");
    TVar1.length_ = local_2b8.length_;
    TVar1.ptr_ = local_2b8.ptr_;
    TVar1.is_immutable_ = local_2b8.is_immutable_;
    TVar1._17_7_ = local_2b8._17_7_;
    TVar1.id_ = local_2b8.id_;
    TVar3.length_ = local_2d8.length_;
    TVar3.ptr_ = local_2d8.ptr_;
    TVar3.is_immutable_ = local_2d8.is_immutable_;
    TVar3._17_7_ = local_2d8._17_7_;
    TVar3.id_ = local_2d8.id_;
    ctemplate::TemplateDictionary::SetValue(TVar1,TVar3);
    std::__cxx11::string::string((string *)expected,"FOO2",(allocator *)&dump);
    TVar4._17_7_ = uStack_397;
    TVar4.is_immutable_ = true;
    TVar2.length_._0_1_ = expected[8];
    TVar2.length_._1_1_ = expected[9];
    TVar2.length_._2_1_ = expected[10];
    TVar2.length_._3_1_ = expected[0xb];
    TVar2.length_._4_1_ = expected[0xc];
    TVar2.length_._5_1_ = expected[0xd];
    TVar2.length_._6_1_ = expected[0xe];
    TVar2.length_._7_1_ = expected[0xf];
    TVar2.ptr_ = (char *)expected._0_8_;
    TVar2._16_8_ = (ulong)uStack_357 << 8;
    TVar2.id_ = 0;
    TVar4.length_ = 4;
    TVar4.ptr_ = "foo2andmore";
    TVar4.id_ = 0;
    ctemplate::TemplateDictionary::SetValue(TVar2,TVar4);
    std::__cxx11::string::~string((string *)expected);
    ctemplate::TemplateString::TemplateString((TemplateString *)expected,"FOO3");
    dump._M_dataplus._M_p = (pointer)&dict;
    value.end_ = "";
    value.begin_ = "foo3";
    dump._M_string_length = (size_type)expected;
    ctemplate::TemplateDictionary::SetProxy::operator=((SetProxy *)&dump,value);
    std::__cxx11::string::string((string *)&dump,"FOO4",&local_3f1);
    expected._0_8_ = dump._M_dataplus._M_p;
    expected[8] = (undefined1)dump._M_string_length;
    expected[9] = dump._M_string_length._1_1_;
    expected[10] = dump._M_string_length._2_1_;
    expected[0xb] = dump._M_string_length._3_1_;
    expected[0xc] = dump._M_string_length._4_1_;
    expected[0xd] = dump._M_string_length._5_1_;
    expected[0xe] = dump._M_string_length._6_1_;
    expected[0xf] = dump._M_string_length._7_1_;
    expected[0x10] = '\0';
    expected[0x18] = '\0';
    expected[0x19] = '\0';
    expected[0x1a] = '\0';
    expected[0x1b] = '\0';
    expected[0x1c] = '\0';
    expected[0x1d] = '\0';
    expected[0x1e] = '\0';
    expected[0x1f] = '\0';
    peer.dict_ = &dict;
    value_00.end_ = "andmore";
    value_00.begin_ = "foo4andmore";
    ctemplate::TemplateDictionary::SetProxy::operator=((SetProxy *)&peer,value_00);
    std::__cxx11::string::~string((string *)&dump);
    std::__cxx11::string::string((string *)expected,"Olaf",&local_3f1);
    uVar5 = expected._8_8_;
    pcVar10 = (char *)expected._0_8_;
    ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"FOO5");
    pcVar8 = (char *)((long)pcVar10 + uVar5);
    if (uVar5 == 0) {
      pcVar10 = (char *)0x0;
      pcVar8 = (char *)0x0;
    }
    peer.dict_ = &dict;
    value_01.end_ = pcVar8;
    value_01.begin_ = pcVar10;
    ctemplate::TemplateDictionary::SetProxy::operator=((SetProxy *)&peer,value_01);
    std::__cxx11::string::~string((string *)expected);
    ctemplate::TemplateString::TemplateString((TemplateString *)expected,"FOO6");
    dump._M_dataplus._M_p = (pointer)&dict;
    dump._M_string_length = (size_type)expected;
    ctemplate::TemplateDictionary::SetProxy::operator=((SetProxy *)&dump,6);
    ctemplate::TemplateString::TemplateString((TemplateString *)expected,"FOO7");
    dump._M_dataplus._M_p = (pointer)&dict;
    dump._M_string_length = (size_type)expected;
    ctemplate::TemplateDictionary::SetProxy::operator=((SetProxy *)&dump,7);
    peer.dict_ = &dict;
    ctemplate::TemplateString::TemplateString((TemplateString *)expected,"FOO");
    ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"foo");
    bVar6 = ctemplate::TemplateDictionaryPeer::ValueIs
                      (&peer,(TemplateString *)expected,(TemplateString *)&dump);
    if (!bVar6) break;
    ctemplate::TemplateString::TemplateString((TemplateString *)expected,"FOO2");
    ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"foo2");
    bVar6 = ctemplate::TemplateDictionaryPeer::ValueIs
                      (&peer,(TemplateString *)expected,(TemplateString *)&dump);
    if (!bVar6) {
      pcVar8 = "peer.ValueIs(\"FOO2\", \"foo2\")";
      goto LAB_001094c0;
    }
    dump._M_dataplus._M_p = (pointer)&dump.field_2;
    dump._M_string_length = 0;
    dump.field_2._M_local_buf[0] = '\0';
    ctemplate::TemplateDictionary::DumpToString((string *)&dict,(int)(TemplateString *)&dump);
    snprintf(expected,0x100,
             "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n};\ndictionary \'test_arena%d\' {\n   FOO: >foo<\n   FOO2: >foo2<\n   FOO3: >foo3<\n   FOO4: >foo4<\n   FOO5: >Olaf<\n   FOO6: >6<\n   FOO7: >7<\n}\n"
             ,uVar9 & 0xffffffff);
    iVar7 = strcmp(dump._M_dataplus._M_p,expected);
    if (iVar7 != 0) {
      pcVar8 = "strcmp(dump.c_str(), expected) == 0";
      goto LAB_001094c0;
    }
    std::__cxx11::string::~string((string *)&dump);
    ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
    uVar9 = uVar9 + 1;
  }
  pcVar8 = "peer.ValueIs(\"FOO\", \"foo\")";
LAB_001094c0:
  fprintf(_stderr,"Check failed: %s\n",pcVar8);
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetValueAndTemplateStringAndArena) {
  // Try both with the arena, and without.
  UnsafeArena arena(100);
  // We run the test with arena twice to double-check we don't ever delete it
  UnsafeArena* arenas[] = {&arena, &arena, NULL};
  for (int i = 0; i < sizeof(arenas)/sizeof(*arenas); ++i) {
    TemplateDictionary dict(string("test_arena") + char('0'+i), arenas[i]);

    // Test copying char*s, strings, and explicit TemplateStrings
    dict.SetValue("FOO", "foo");
    dict.SetValue(string("FOO2"), TemplateString("foo2andmore", 4));
		dict["FOO3"] = "foo3";
		dict[string("FOO4")] = TemplateString("foo4andmore", 4);
		dict["FOO5"] = string("Olaf");
		dict["FOO6"] = 6;
		dict["FOO7"] = long(7);

    TemplateDictionaryPeer peer(&dict);
    // verify what happened
    EXPECT_TRUE(peer.ValueIs("FOO", "foo"));
    EXPECT_TRUE(peer.ValueIs("FOO2", "foo2"));
    string dump;
    dict.DumpToString(&dump);
    char expected[256];
    snprintf(expected, sizeof(expected),
             ("global dictionary {\n"
              "   BI_NEWLINE: >\n"
              "<\n"
              "   BI_SPACE: > <\n"
              "   GLOBAL: >top<\n"
              "};\n"
              "dictionary 'test_arena%d' {\n"
              "   FOO: >foo<\n"
              "   FOO2: >foo2<\n"
              "   FOO3: >foo3<\n"
              "   FOO4: >foo4<\n"
              "   FOO5: >Olaf<\n"
              "   FOO6: >6<\n"
              "   FOO7: >7<\n"
              "}\n"), i);
    EXPECT_STREQ(dump.c_str(), expected);
  }
}